

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

void mpc_optimise_unretained(mpc_parser_t *p,int force)

{
  int iVar1;
  mpc_check_t p_Var2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char cVar6;
  undefined6 uVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  mpc_parser_t **ppmVar11;
  mpc_parser_t *p_00;
  long lVar12;
  mpc_parser_t *__ptr;
  long lVar13;
  
  if ((force == 0) && (p->retained != '\0')) {
    return;
  }
  if (p->type == '\x05') {
    mpc_optimise_unretained((p->data).expect.x,0);
  }
  if (p->type == '\x0f') {
    mpc_optimise_unretained((p->data).expect.x,0);
  }
  if (p->type == '\x10') {
    mpc_optimise_unretained((p->data).expect.x,0);
  }
  if (p->type == '\x19') {
    mpc_optimise_unretained((p->data).expect.x,0);
  }
  if (p->type == '\x1a') {
    mpc_optimise_unretained((p->data).expect.x,0);
  }
  if (p->type == '\x11') {
    mpc_optimise_unretained((p->data).expect.x,0);
  }
  if (p->type == '\x12') {
    mpc_optimise_unretained((p->data).expect.x,0);
  }
  if (p->type == '\x13') {
    mpc_optimise_unretained((p->data).expect.x,0);
  }
  if (p->type == '\x14') {
    mpc_optimise_unretained((p->data).repeat.x,0);
  }
  if (p->type == '\x15') {
    mpc_optimise_unretained((p->data).repeat.x,0);
  }
  if (p->type == '\x16') {
    mpc_optimise_unretained((p->data).repeat.x,0);
  }
  if ((p->type == '\x17') && (0 < (p->data).repeat.n)) {
    lVar12 = 0;
    do {
      mpc_optimise_unretained(*(mpc_parser_t **)((long)(p->data).lift.x + lVar12 * 8),0);
      lVar12 = lVar12 + 1;
    } while (lVar12 < (p->data).repeat.n);
  }
  if ((p->type == '\x18') && (0 < (p->data).repeat.n)) {
    lVar12 = 0;
    do {
      mpc_optimise_unretained(*(mpc_parser_t **)((long)(p->data).apply_to.d + lVar12 * 8),0);
      lVar12 = lVar12 + 1;
    } while (lVar12 < (p->data).repeat.n);
  }
  do {
    if (p->type == '\x17') {
      pvVar9 = (p->data).lift.x;
      iVar1 = (p->data).repeat.n;
      __ptr = *(mpc_parser_t **)((long)pvVar9 + (long)iVar1 * 8 + -8);
      if ((__ptr->type == '\x17') && (__ptr->retained == '\0')) {
        iVar8 = (__ptr->data).repeat.n;
        lVar12 = (long)iVar8;
        iVar8 = iVar1 + iVar8 + -1;
        (p->data).repeat.n = iVar8;
        pvVar10 = realloc(pvVar9,(long)iVar8 << 3);
        (p->data).lift.x = pvVar10;
        pvVar10 = (void *)((long)pvVar10 + (long)iVar1 * 8 + -8);
        pvVar9 = (__ptr->data).lift.x;
      }
      else {
        ppmVar11 = (p->data).or.xs;
        __ptr = *ppmVar11;
        if ((__ptr->type != '\x17') || (__ptr->retained != '\0')) goto LAB_001e648e;
        iVar1 = (p->data).repeat.n;
        iVar8 = (__ptr->data).repeat.n;
        lVar12 = (long)iVar8;
        iVar8 = iVar8 + iVar1 + -1;
        (p->data).repeat.n = iVar8;
        pvVar10 = realloc(ppmVar11,(long)iVar8 << 3);
        (p->data).lift.x = pvVar10;
        memmove((void *)((long)pvVar10 + lVar12 * 8),(void *)((long)pvVar10 + 8),(long)iVar1 * 8 - 8
               );
        pvVar9 = (__ptr->data).lift.x;
      }
      memmove(pvVar10,pvVar9,lVar12 << 3);
      free((__ptr->data).lift.x);
      free(__ptr->name);
    }
    else {
LAB_001e648e:
      if (p->type != '\x18') {
        return;
      }
      if ((p->data).repeat.n == 2) {
        ppmVar11 = (p->data).and.xs;
        p_00 = *ppmVar11;
        if (((p_00->type != '\x01') || (p_00->retained != '\0')) ||
           ((code *)(p->data).lift.x != mpcf_fold_ast)) goto code_r0x001e64c1;
LAB_001e66a0:
        __ptr = ppmVar11[1];
        mpc_delete(p_00);
        free((p->data).apply_to.d);
        free((p->data).check_with.d);
        free(p->name);
        cVar6 = __ptr->retained;
        uVar7 = *(undefined6 *)&__ptr->field_0x32;
        p->type = __ptr->type;
        p->retained = cVar6;
        *(undefined6 *)&p->field_0x32 = uVar7;
        pcVar3 = __ptr->name;
        pcVar4 = (__ptr->data).fail.m;
        pvVar9 = (__ptr->data).lift.x;
        pvVar10 = (__ptr->data).apply_to.d;
        pcVar5 = (__ptr->data).check_with.e;
        (p->data).check.e = (__ptr->data).check.e;
        (p->data).check_with.e = pcVar5;
        (p->data).lift.x = pvVar9;
        (p->data).apply_to.d = pvVar10;
        p->name = pcVar3;
        (p->data).fail.m = pcVar4;
      }
      else {
code_r0x001e64c1:
        if ((code *)(p->data).lift.x == mpcf_fold_ast) {
          ppmVar11 = (p->data).and.xs;
          __ptr = *ppmVar11;
          if (((__ptr->type != '\x18') || (__ptr->retained != '\0')) ||
             ((code *)(__ptr->data).lift.x != mpcf_fold_ast)) goto code_r0x001e64ee;
          iVar1 = (p->data).repeat.n;
          iVar8 = (__ptr->data).repeat.n;
          lVar13 = (long)iVar8;
          lVar12 = lVar13 + iVar1;
          (p->data).repeat.n = iVar8 + iVar1 + -1;
          pvVar9 = realloc(ppmVar11,lVar12 * 8 - 8);
          (p->data).apply_to.d = pvVar9;
          pvVar9 = realloc((p->data).check_with.d,(long)(int)lVar12 * 8 - 0x10);
          (p->data).check_with.d = pvVar9;
          p_Var2 = (p->data).check.f;
          memmove(p_Var2 + lVar13 * 8,p_Var2 + 8,(long)iVar1 * 8 - 8);
          memmove((p->data).apply_to.d,(__ptr->data).apply_to.d,lVar13 << 3);
          if (1 < (p->data).repeat.n) {
            lVar12 = 0;
            do {
              *(code **)((p->data).check.e + lVar12 * 8) = mpc_ast_delete;
              lVar12 = lVar12 + 1;
            } while (lVar12 < (long)(p->data).repeat.n + -1);
          }
LAB_001e690b:
          free((__ptr->data).apply_to.d);
          free((__ptr->data).check_with.d);
          free(__ptr->name);
        }
        else {
code_r0x001e64ee:
          if ((code *)(p->data).lift.x == mpcf_fold_ast) {
            pvVar9 = (p->data).apply_to.d;
            iVar1 = (p->data).repeat.n;
            lVar12 = (long)iVar1;
            __ptr = *(mpc_parser_t **)((long)pvVar9 + lVar12 * 8 + -8);
            if (((__ptr->type == '\x18') && (__ptr->retained == '\0')) &&
               ((code *)(__ptr->data).lift.x == mpcf_fold_ast)) {
              iVar8 = (__ptr->data).repeat.n;
              lVar13 = iVar8 + lVar12;
              (p->data).repeat.n = iVar8 + iVar1 + -1;
              pvVar9 = realloc(pvVar9,lVar13 * 8 - 8);
              (p->data).apply_to.d = pvVar9;
              pvVar9 = realloc((p->data).check_with.d,(long)(int)lVar13 * 8 - 0x10);
              (p->data).check_with.d = pvVar9;
              memmove((void *)((long)(p->data).apply_to.d + lVar12 * 8 + -8),
                      (__ptr->data).apply_to.d,(long)iVar8 << 3);
              if (1 < (p->data).repeat.n) {
                lVar12 = 0;
                do {
                  *(code **)((p->data).check.e + lVar12 * 8) = mpc_ast_delete;
                  lVar12 = lVar12 + 1;
                } while (lVar12 < (long)(p->data).repeat.n + -1);
              }
              goto LAB_001e690b;
            }
          }
          if ((p->data).repeat.n == 2) {
            ppmVar11 = (p->data).and.xs;
            p_00 = *ppmVar11;
            if ((((p_00->type == '\x03') && ((p_00->data).lift.lf == mpcf_ctor_str)) &&
                (p_00->retained == '\0')) && ((code *)(p->data).lift.x == mpcf_strfold))
            goto LAB_001e66a0;
          }
          if ((code *)(p->data).lift.x == mpcf_strfold) {
            ppmVar11 = (p->data).and.xs;
            __ptr = *ppmVar11;
            if (((__ptr->type == '\x18') && (__ptr->retained == '\0')) &&
               ((code *)(__ptr->data).lift.x == mpcf_strfold)) {
              iVar1 = (p->data).repeat.n;
              iVar8 = (__ptr->data).repeat.n;
              lVar13 = (long)iVar8;
              lVar12 = lVar13 + iVar1;
              (p->data).repeat.n = iVar8 + iVar1 + -1;
              pvVar9 = realloc(ppmVar11,lVar12 * 8 - 8);
              (p->data).apply_to.d = pvVar9;
              pvVar9 = realloc((p->data).check_with.d,(long)(int)lVar12 * 8 - 0x10);
              (p->data).check_with.d = pvVar9;
              p_Var2 = (p->data).check.f;
              memmove(p_Var2 + lVar13 * 8,p_Var2 + 8,(long)iVar1 * 8 - 8);
              memmove((p->data).apply_to.d,(__ptr->data).apply_to.d,lVar13 << 3);
              if (1 < (p->data).repeat.n) {
                lVar12 = 0;
                do {
                  *(code **)((p->data).check.e + lVar12 * 8) = free;
                  lVar12 = lVar12 + 1;
                } while (lVar12 < (long)(p->data).repeat.n + -1);
              }
              goto LAB_001e690b;
            }
          }
          if ((code *)(p->data).lift.x != mpcf_strfold) {
            return;
          }
          pvVar9 = (p->data).apply_to.d;
          iVar1 = (p->data).repeat.n;
          lVar12 = (long)iVar1;
          __ptr = *(mpc_parser_t **)((long)pvVar9 + lVar12 * 8 + -8);
          if (__ptr->type != '\x18') {
            return;
          }
          if (__ptr->retained != '\0') {
            return;
          }
          if ((code *)(__ptr->data).lift.x != mpcf_strfold) {
            return;
          }
          iVar8 = (__ptr->data).repeat.n;
          lVar13 = iVar8 + lVar12;
          (p->data).repeat.n = iVar8 + iVar1 + -1;
          pvVar9 = realloc(pvVar9,lVar13 * 8 - 8);
          (p->data).apply_to.d = pvVar9;
          pvVar9 = realloc((p->data).check_with.d,(long)(int)lVar13 * 8 - 0x10);
          (p->data).check_with.d = pvVar9;
          memmove((void *)((long)(p->data).apply_to.d + lVar12 * 8 + -8),(__ptr->data).apply_to.d,
                  (long)iVar8 << 3);
          if (1 < (p->data).repeat.n) {
            lVar12 = 0;
            do {
              *(code **)((p->data).check.e + lVar12 * 8) = free;
              lVar12 = lVar12 + 1;
            } while (lVar12 < (long)(p->data).repeat.n + -1);
          }
          free((__ptr->data).apply_to.d);
          free((__ptr->data).check_with.d);
          free(__ptr->name);
        }
      }
    }
    free(__ptr);
  } while( true );
}

Assistant:

static void mpc_optimise_unretained(mpc_parser_t *p, int force) {

  int i, n, m;
  mpc_parser_t *t;

  if (p->retained && !force) { return; }

  /* Optimise Subexpressions */

  if (p->type == MPC_TYPE_EXPECT)     { mpc_optimise_unretained(p->data.expect.x, 0); }
  if (p->type == MPC_TYPE_APPLY)      { mpc_optimise_unretained(p->data.apply.x, 0); }
  if (p->type == MPC_TYPE_APPLY_TO)   { mpc_optimise_unretained(p->data.apply_to.x, 0); }
  if (p->type == MPC_TYPE_CHECK)      { mpc_optimise_unretained(p->data.check.x, 0); }
  if (p->type == MPC_TYPE_CHECK_WITH) { mpc_optimise_unretained(p->data.check_with.x, 0); }
  if (p->type == MPC_TYPE_PREDICT)    { mpc_optimise_unretained(p->data.predict.x, 0); }
  if (p->type == MPC_TYPE_NOT)        { mpc_optimise_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MAYBE)      { mpc_optimise_unretained(p->data.not.x, 0); }
  if (p->type == MPC_TYPE_MANY)       { mpc_optimise_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_MANY1)      { mpc_optimise_unretained(p->data.repeat.x, 0); }
  if (p->type == MPC_TYPE_COUNT)      { mpc_optimise_unretained(p->data.repeat.x, 0); }

  if (p->type == MPC_TYPE_OR) {
    for(i = 0; i < p->data.or.n; i++) {
      mpc_optimise_unretained(p->data.or.xs[i], 0);
    }
  }

  if (p->type == MPC_TYPE_AND) {
    for(i = 0; i < p->data.and.n; i++) {
      mpc_optimise_unretained(p->data.and.xs[i], 0);
    }
  }

  /* Perform optimisations */

  while (1) {

    /* Merge rhs `or` */
    if (p->type == MPC_TYPE_OR
    &&  p->data.or.xs[p->data.or.n-1]->type == MPC_TYPE_OR
    && !p->data.or.xs[p->data.or.n-1]->retained) {
      t = p->data.or.xs[p->data.or.n-1];
      n = p->data.or.n; m = t->data.or.n;
      p->data.or.n = n + m - 1;
      p->data.or.xs = realloc(p->data.or.xs, sizeof(mpc_parser_t*) * (n + m -1));
      memmove(p->data.or.xs + n - 1, t->data.or.xs, m * sizeof(mpc_parser_t*));
      free(t->data.or.xs); free(t->name); free(t);
      continue;
    }

    /* Merge lhs `or` */
    if (p->type == MPC_TYPE_OR
    &&  p->data.or.xs[0]->type == MPC_TYPE_OR
    && !p->data.or.xs[0]->retained) {
      t = p->data.or.xs[0];
      n = p->data.or.n; m = t->data.or.n;
      p->data.or.n = n + m - 1;
      p->data.or.xs = realloc(p->data.or.xs, sizeof(mpc_parser_t*) * (n + m -1));
      memmove(p->data.or.xs + m, p->data.or.xs + 1, (n - 1) * sizeof(mpc_parser_t*));
      memmove(p->data.or.xs, t->data.or.xs, m * sizeof(mpc_parser_t*));
      free(t->data.or.xs); free(t->name); free(t);
      continue;
    }

    /* Remove ast `pass` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.n == 2
    &&  p->data.and.xs[0]->type == MPC_TYPE_PASS
    && !p->data.and.xs[0]->retained
    &&  p->data.and.f == mpcf_fold_ast) {
      t = p->data.and.xs[1];
      mpc_delete(p->data.and.xs[0]);
      free(p->data.and.xs); free(p->data.and.dxs); free(p->name);
      memcpy(p, t, sizeof(mpc_parser_t));
      free(t);
      continue;
    }

    /* Merge ast lhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_fold_ast
    &&  p->data.and.xs[0]->type == MPC_TYPE_AND
    && !p->data.and.xs[0]->retained
    &&  p->data.and.xs[0]->data.and.f == mpcf_fold_ast) {
      t = p->data.and.xs[0];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m - 1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + m, p->data.and.xs + 1, (n - 1) * sizeof(mpc_parser_t*));
      memmove(p->data.and.xs, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = (mpc_dtor_t)mpc_ast_delete; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    /* Merge ast rhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_fold_ast
    &&  p->data.and.xs[p->data.and.n-1]->type == MPC_TYPE_AND
    && !p->data.and.xs[p->data.and.n-1]->retained
    &&  p->data.and.xs[p->data.and.n-1]->data.and.f == mpcf_fold_ast) {
      t = p->data.and.xs[p->data.and.n-1];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m -1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + n - 1, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = (mpc_dtor_t)mpc_ast_delete; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    /* Remove re `lift` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.n == 2
    &&  p->data.and.xs[0]->type == MPC_TYPE_LIFT
    &&  p->data.and.xs[0]->data.lift.lf == mpcf_ctor_str
    && !p->data.and.xs[0]->retained
    &&  p->data.and.f == mpcf_strfold) {
      t = p->data.and.xs[1];
      mpc_delete(p->data.and.xs[0]);
      free(p->data.and.xs); free(p->data.and.dxs); free(p->name);
      memcpy(p, t, sizeof(mpc_parser_t));
      free(t);
      continue;
    }

    /* Merge re lhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_strfold
    &&  p->data.and.xs[0]->type == MPC_TYPE_AND
    && !p->data.and.xs[0]->retained
    &&  p->data.and.xs[0]->data.and.f == mpcf_strfold) {
      t = p->data.and.xs[0];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m - 1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + m, p->data.and.xs + 1, (n - 1) * sizeof(mpc_parser_t*));
      memmove(p->data.and.xs, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = free; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    /* Merge re rhs `and` */
    if (p->type == MPC_TYPE_AND
    &&  p->data.and.f == mpcf_strfold
    &&  p->data.and.xs[p->data.and.n-1]->type == MPC_TYPE_AND
    && !p->data.and.xs[p->data.and.n-1]->retained
    &&  p->data.and.xs[p->data.and.n-1]->data.and.f == mpcf_strfold) {
      t = p->data.and.xs[p->data.and.n-1];
      n = p->data.and.n; m = t->data.and.n;
      p->data.and.n = n + m - 1;
      p->data.and.xs = realloc(p->data.and.xs, sizeof(mpc_parser_t*) * (n + m -1));
      p->data.and.dxs = realloc(p->data.and.dxs, sizeof(mpc_dtor_t) * (n + m - 1 - 1));
      memmove(p->data.and.xs + n - 1, t->data.and.xs, m * sizeof(mpc_parser_t*));
      for (i = 0; i < p->data.and.n-1; i++) { p->data.and.dxs[i] = free; }
      free(t->data.and.xs); free(t->data.and.dxs); free(t->name); free(t);
      continue;
    }

    return;

  }

}